

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

void soul::buildFunctions(ModuleBase *module,Module *m,StringDictionary *dictionary)

{
  SourceCodeText *pSVar1;
  long *plVar2;
  pointer pSVar3;
  Ptr PVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  SourceCodeText *oldObject_1;
  undefined4 extraout_var;
  long lVar9;
  Function *extraout_RDX;
  Function *extraout_RDX_00;
  Function *f;
  VariableDeclaration *v;
  VariableDeclaration *v_00;
  long *plVar10;
  CodeLocationRange nameWithGenerics;
  CodeLocation openParen;
  pointer local_338;
  undefined1 auStack_330 [16];
  pointer local_320;
  Ptr local_318;
  UTF8Reader local_310;
  Ptr local_308;
  UTF8Reader local_300;
  long *local_2f0;
  Expression local_2e8;
  undefined1 local_2c8 [32];
  Ptr PStack_2a8;
  UTF8Reader local_2a0;
  Ptr PStack_298;
  UTF8Reader local_290;
  pointer pSStack_288;
  pointer local_280;
  pointer pSStack_278;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  bool local_210;
  vector<soul::SourceCodeModel::Function,_std::allocator<soul::SourceCodeModel::Function>_>
  *local_208;
  string *local_200;
  string *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  SourceCodeText *local_1e0;
  long *local_1d8;
  string *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  string local_1b8;
  CodeLocationRange local_198;
  CodeLocation local_178;
  SourceCodeText *local_168;
  char *local_160;
  undefined1 local_158 [88];
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  string local_e0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_> local_80
  ;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  long *plVar8;
  
  iVar7 = (*(module->super_ASTObject)._vptr_ASTObject[0xc])();
  plVar8 = (long *)CONCAT44(extraout_var,iVar7);
  if (plVar8 != (long *)0x0) {
    plVar10 = (long *)*plVar8;
    local_1d8 = (long *)plVar8[1];
    if (plVar10 != local_1d8) {
      local_1e8 = &local_e0.field_2;
      local_200 = (string *)&local_c0;
      local_1f0 = &local_b0;
      local_1f8 = &m->fullyQualifiedName;
      local_1c0 = &local_240;
      local_1d0 = (string *)&local_230;
      local_1c8 = &local_220;
      local_208 = &m->functions;
      do {
        bVar6 = shouldShow(*(soul **)(*plVar10 + 0x10),*(Function **)(*plVar10 + 0x18));
        if (bVar6) {
          local_158[0] = false;
          local_158[1] = false;
          local_158[2] = false;
          local_158[3] = false;
          local_158._72_8_ = (pointer)0x0;
          local_158._80_8_ = (pointer)0x0;
          local_158._56_8_ = (char *)0x0;
          local_158._64_8_ = (pointer)0x0;
          local_158._40_8_ = (char *)0x0;
          local_158._48_8_ = (SourceCodeText *)0x0;
          local_158._24_8_ = (pointer)0x0;
          local_158._32_8_ = (SourceCodeText *)0x0;
          local_158._8_8_ = (pointer)0x0;
          local_158._16_8_ = (pointer)0x0;
          local_100._M_p = (pointer)&local_f0;
          local_f8 = 0;
          local_f0._M_local_buf[0] = '\0';
          local_e0._M_dataplus._M_p = (pointer)local_1e8;
          local_e0._M_string_length = 0;
          local_e0.field_2._M_local_buf[0] = '\0';
          local_c0._M_p = (pointer)local_1f0;
          local_b8 = 0;
          local_b0._M_local_buf[0] = '\0';
          local_a0._M_p = (pointer)&local_90;
          local_98 = 0;
          local_90._M_local_buf[0] = '\0';
          local_80.
          super__Vector_base<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_80.
          super__Vector_base<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_80.
          super__Vector_base<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68._M_buckets = &local_68._M_single_bucket;
          local_68._M_bucket_count = 1;
          local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_68._M_element_count = 0;
          local_68._M_rehash_policy._M_max_load_factor = 1.0;
          local_68._M_rehash_policy._M_next_resize = 0;
          local_68._M_single_bucket = (__node_base_ptr)0x0;
          getComment((Comment *)local_2c8,*(soul **)(*plVar10 + 0x10),*(Context **)(*plVar10 + 0x18)
                    );
          auStack_330._8_8_ = local_158._24_8_;
          auStack_330._0_8_ = local_158._16_8_;
          local_338 = (pointer)local_158._8_8_;
          local_158._0_4_ = local_2c8._0_4_;
          local_158._24_8_ = local_2c8._24_8_;
          local_158._8_8_ = local_2c8._8_8_;
          local_158._16_8_ = local_2c8._16_8_;
          local_2c8._8_8_ = (pointer)0x0;
          local_2c8._16_8_ = (pointer)0x0;
          local_2c8._24_8_ = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_338);
          uVar5 = local_158._32_8_;
          if (PStack_2a8.object != (SourceCodeText *)local_158._32_8_) {
            local_158._32_8_ = PStack_2a8.object;
            PStack_2a8.object = (SourceCodeText *)0x0;
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar5);
          }
          uVar5 = local_158._48_8_;
          local_158._40_8_ = local_2a0.data;
          if (PStack_298.object != (SourceCodeText *)local_158._48_8_) {
            local_158._48_8_ = PStack_298.object;
            PStack_298.object = (SourceCodeText *)0x0;
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar5);
          }
          local_158._56_8_ = local_290.data;
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PStack_298.object);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PStack_2a8.object);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_2c8 + 8));
          if (*(long *)(*plVar10 + 0x38) == 0) {
            throwInternalCompilerError("isValid()","toString",0x23);
          }
          std::__cxx11::string::_M_assign((string *)&local_e0);
          TokenisedPathString::join((string *)local_2c8,local_1f8,&local_e0);
          std::__cxx11::string::operator=((string *)&local_a0,(string *)local_2c8);
          f = extraout_RDX;
          if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
            operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
            f = extraout_RDX_00;
          }
          makeUID_abi_cxx11_((string *)local_2c8,(soul *)*plVar10,f);
          std::__cxx11::string::operator=((string *)&local_100,(string *)local_2c8);
          if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
            operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
          }
          lVar9 = *plVar10;
          pSVar1 = *(SourceCodeText **)(lVar9 + 0x40);
          if (pSVar1 != (SourceCodeText *)0x0) {
            (pSVar1->super_RefCountedObject).refCount =
                 (pSVar1->super_RefCountedObject).refCount + 1;
          }
          local_178.location.data = *(char **)(lVar9 + 0x48);
          local_178.sourceCode.object = pSVar1;
          SourceCodeUtilities::findNextOccurrence((SourceCodeUtilities *)&local_168,&local_178,'(');
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar1);
          pSVar1 = local_168;
          if ((local_168 == (SourceCodeText *)0x0) || ((local_168->content)._M_string_length == 0))
          {
            throwInternalCompilerError("! openParen.isEmpty()","buildFunctions",0x182);
          }
          lVar9 = *plVar10;
          local_1e0 = *(SourceCodeText **)(lVar9 + 0x40);
          if (local_1e0 != (SourceCodeText *)0x0) {
            (local_1e0->super_RefCountedObject).refCount =
                 (local_1e0->super_RefCountedObject).refCount + 1;
          }
          local_198.start.location.data = *(char **)(lVar9 + 0x48);
          local_198.end.sourceCode.object = local_168;
          (local_168->super_RefCountedObject).refCount =
               (local_168->super_RefCountedObject).refCount + 1;
          local_198.end.location.data = local_160;
          local_198.start.sourceCode.object = local_1e0;
          CodeLocationRange::toString_abi_cxx11_(&local_1b8,&local_198);
          simplifyWhitespace((string *)local_2c8,&local_1b8);
          std::__cxx11::string::operator=(local_200,(string *)local_2c8);
          if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
            operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          lVar9 = *plVar10;
          if (*(Expression **)(lVar9 + 0x30) != (Expression *)0x0) {
            ExpressionHelpers::create
                      ((Expression *)&local_338,*(Expression **)(lVar9 + 0x30),dictionary);
            local_2c8._16_8_ = local_158._80_8_;
            local_2c8._8_8_ = local_158._72_8_;
            local_2c8._0_8_ = local_158._64_8_;
            local_158._80_8_ = auStack_330._8_8_;
            local_158._64_8_ = local_338;
            local_158._72_8_ = auStack_330._0_8_;
            local_338 = (pointer)0x0;
            auStack_330._0_8_ = (pointer)0x0;
            auStack_330._8_8_ = (pointer)0x0;
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)local_2c8);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)&local_338);
            lVar9 = *plVar10;
          }
          plVar8 = *(long **)(lVar9 + 0x58);
          plVar2 = *(long **)(lVar9 + 0x60);
          local_2f0 = plVar10;
          if (plVar8 != plVar2) {
            do {
              local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
              local_280 = (pointer)0x0;
              pSStack_278 = (pointer)0x0;
              local_290.data = (char *)0x0;
              pSStack_288 = (pointer)0x0;
              local_2a0.data = (char *)0x0;
              PStack_298.object = (SourceCodeText *)0x0;
              local_2c8._24_8_ = (pointer)0x0;
              PStack_2a8.object = (SourceCodeText *)0x0;
              local_2c8._8_8_ = (pointer)0x0;
              local_2c8._16_8_ = (pointer)0x0;
              local_270._M_p = (pointer)&local_260;
              local_268 = 0;
              local_260._M_local_buf[0] = '\0';
              local_250._M_p = (pointer)local_1c0;
              local_248 = 0;
              local_240._M_local_buf[0] = '\0';
              local_230._M_p = (pointer)local_1c8;
              local_228 = 0;
              local_220._M_local_buf[0] = '\0';
              local_210 = false;
              getComment((Comment *)&local_338,*(soul **)(*plVar8 + 0x10),
                         *(Context **)(*plVar8 + 0x18));
              local_2e8.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2c8._24_8_;
              local_2e8.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2c8._16_8_;
              local_2e8.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2c8._8_8_;
              pSVar3 = local_338;
              local_2c8[0] = local_338._0_1_;
              local_2c8[1] = local_338._1_1_;
              local_2c8[2] = local_338._2_1_;
              local_2c8[3] = local_338._3_1_;
              local_2c8._24_8_ = local_320;
              local_2c8._8_8_ = auStack_330._0_8_;
              local_2c8._16_8_ = auStack_330._8_8_;
              auStack_330._0_8_ = (pointer)0x0;
              auStack_330._8_8_ = (pointer)0x0;
              local_320 = (pointer)0x0;
              local_338 = pSVar3;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_2e8);
              PVar4.object = PStack_2a8.object;
              if (local_318.object != PStack_2a8.object) {
                PStack_2a8.object = local_318.object;
                local_318.object = (SourceCodeText *)0x0;
                RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PVar4.object);
              }
              PVar4.object = PStack_298.object;
              local_2a0.data = local_310.data;
              if (local_308.object != PStack_298.object) {
                PStack_298.object = local_308.object;
                local_308.object = (SourceCodeText *)0x0;
                RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PVar4.object);
              }
              local_290.data = local_300.data;
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_308.object);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_318.object);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_330);
              if (*(long *)(*plVar8 + 0x28) == 0) {
                throwInternalCompilerError("isValid()","toString",0x23);
              }
              std::__cxx11::string::_M_assign((string *)&local_250);
              makeUID_abi_cxx11_((string *)&local_338,(soul *)*plVar8,v);
              std::__cxx11::string::operator=((string *)&local_270,(string *)&local_338);
              if (local_338 != (pointer)(auStack_330 + 8)) {
                operator_delete(local_338,
                                (ulong)((long)&((_Alloc_hider *)auStack_330._8_8_)->_M_p + 1));
              }
              ExpressionHelpers::forVariable(&local_2e8,(VariableDeclaration *)*plVar8,dictionary);
              auStack_330._8_8_ = pSStack_278;
              auStack_330._0_8_ = local_280;
              local_338 = pSStack_288;
              pSStack_278 = local_2e8.sections.
                            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pSStack_288 = local_2e8.sections.
                            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              local_280 = local_2e8.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              local_2e8.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_2e8.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2e8.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                         *)&local_338);
              std::
              vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ::~vector(&local_2e8.sections);
              getInitialiserValue_abi_cxx11_((string *)&local_338,(soul *)*plVar8,v_00);
              std::__cxx11::string::operator=(local_1d0,(string *)&local_338);
              if (local_338 != (pointer)(auStack_330 + 8)) {
                operator_delete(local_338,
                                (ulong)((long)&((_Alloc_hider *)auStack_330._8_8_)->_M_p + 1));
              }
              std::
              vector<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
              ::emplace_back<soul::SourceCodeModel::Variable>(&local_80,(Variable *)local_2c8);
              SourceCodeModel::Variable::~Variable((Variable *)local_2c8);
              plVar8 = plVar8 + 1;
            } while (plVar8 != plVar2);
            lVar9 = *local_2f0;
          }
          createAnnotation((Annotation *)local_2c8,*(soul **)(lVar9 + 0xb0),
                           *(Annotation **)(lVar9 + 0xb8),dictionary);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign(&local_68,
                           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_2c8);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_2c8);
          std::
          vector<soul::SourceCodeModel::Function,_std::allocator<soul::SourceCodeModel::Function>_>
          ::emplace_back<soul::SourceCodeModel::Function>(local_208,(Function *)local_158);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar1);
          plVar10 = local_2f0;
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1e0);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar1);
          SourceCodeModel::Function::~Function((Function *)local_158);
        }
        plVar10 = plVar10 + 1;
      } while (plVar10 != local_1d8);
    }
  }
  return;
}

Assistant:

static void buildFunctions (AST::ModuleBase& module, SourceCodeModel::Module& m, const StringDictionary& dictionary)
{
    if (auto functions = module.getFunctionList())
    {
        for (auto& f : *functions)
        {
            if (shouldShow (f))
            {
                SourceCodeModel::Function desc;
                desc.comment = getComment (f->context);
                desc.bareName = f->name.toString();
                desc.fullyQualifiedName = TokenisedPathString::join (m.fullyQualifiedName, desc.bareName);
                desc.UID = makeUID (f);

                auto openParen = SourceCodeUtilities::findNextOccurrence (f->nameLocation.location, '(');
                SOUL_ASSERT (! openParen.isEmpty());

                CodeLocationRange nameWithGenerics { f->nameLocation.location, openParen };
                desc.nameWithGenerics = simplifyWhitespace (nameWithGenerics.toString());

                if (auto ret = f->returnType.get())
                    desc.returnType = ExpressionHelpers::create (*ret, dictionary);

                for (auto& p : f->parameters)
                {
                    SourceCodeModel::Variable param;
                    param.comment = getComment (p->context);
                    param.name = p->name.toString();
                    param.UID = makeUID (p);
                    param.type = ExpressionHelpers::forVariable (p, dictionary);
                    param.initialiser = getInitialiserValue (p);

                    desc.parameters.push_back (std::move (param));
                }

                desc.annotation = createAnnotation (f->annotation, dictionary);

                m.functions.push_back (std::move (desc));
            }
        }
    }
}